

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

int connection_open(CONNECTION_HANDLE connection)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  
  if (connection == (CONNECTION_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x539;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_open",0x538,1,"NULL connection");
    }
  }
  else {
    iVar1 = 0;
    if ((connection->field_0xe0 & 1) == 0) {
      iVar1 = xio_open(connection->io,connection_on_io_open_complete,connection,
                       connection_on_bytes_received,connection,connection_on_io_error,connection);
      if (iVar1 == 0) {
        connection->field_0xe0 = connection->field_0xe0 | 1;
        iVar1 = 0;
        connection_set_state(connection,CONNECTION_STATE_START);
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                    ,"connection_open",0x541,1,"Opening the underlying IO failed");
        }
        connection_set_state(connection,CONNECTION_STATE_END);
        iVar1 = 0x543;
      }
    }
  }
  return iVar1;
}

Assistant:

int connection_open(CONNECTION_HANDLE connection)
{
    int result;

    if (connection == NULL)
    {
        LogError("NULL connection");
        result = MU_FAILURE;
    }
    else
    {
        if (!connection->is_underlying_io_open)
        {
            if (xio_open(connection->io, connection_on_io_open_complete, connection, connection_on_bytes_received, connection, connection_on_io_error, connection) != 0)
            {
                LogError("Opening the underlying IO failed");
                connection_set_state(connection, CONNECTION_STATE_END);
                result = MU_FAILURE;
            }
            else
            {
                connection->is_underlying_io_open = 1;

                connection_set_state(connection, CONNECTION_STATE_START);

                result = 0;
            }
        }
        else
        {
            result = 0;
        }
    }

    return result;
}